

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.hpp
# Opt level: O0

uint8_t * __thiscall
BTree<NodeBTree,_NodeKey>::searchWithComparison
          (BTree<NodeBTree,_NodeKey> *this,SearchResult *result,uint8_t *data,uint count,
          NodeKey *key,KeyCompareOp compOp)

{
  uint uVar1;
  uint16_t uVar2;
  uint uVar3;
  int iVar4;
  uchar *puVar5;
  int in_ECX;
  uchar *in_RDX;
  uint *in_RSI;
  long in_RDI;
  undefined8 in_R8;
  code *in_stack_00000008;
  long in_stack_00000010;
  uint16_t offset_1;
  int ret;
  uint16_t offset;
  uint mid;
  uint8_t *subData;
  uint index;
  uint low;
  uint high;
  NodeBTree *self;
  code *in_stack_ffffffffffffff68;
  uint32_t offset_00;
  code *in_stack_ffffffffffffff70;
  uchar *local_58;
  uint local_4c;
  uint local_48;
  uint local_44;
  
  uVar2 = getBitsAt((uint8_t *)in_stack_ffffffffffffff70,
                    (uint32_t)((ulong)in_stack_ffffffffffffff68 >> 0x20));
  local_48 = 0;
  local_4c = 0;
  in_RSI[1] = uVar2 & 0x7ff;
  uVar1 = local_48;
  local_44 = uVar2 & 0x7ff;
  while( true ) {
    local_48 = uVar1;
    offset_00 = (uint32_t)((ulong)in_stack_ffffffffffffff68 >> 0x20);
    if (local_44 <= local_48) {
      local_58 = (uchar *)0x0;
      *in_RSI = local_4c;
      in_RSI[2] = 0xffffffff;
      if ((in_ECX != 0) && (local_4c != in_RSI[1])) {
        uVar2 = getBitsAt((uint8_t *)in_stack_ffffffffffffff70,offset_00);
        local_58 = advancePointer<unsigned_char>(in_RDX,(ulong)uVar2);
      }
      return local_58;
    }
    uVar3 = local_48 + (local_44 - local_48 >> 1);
    local_4c = uVar3 + 1;
    uVar2 = getBitsAt((uint8_t *)in_stack_ffffffffffffff70,offset_00);
    puVar5 = advancePointer<unsigned_char>(in_RDX,(ulong)uVar2);
    in_stack_ffffffffffffff68 = in_stack_00000008;
    if (((ulong)in_stack_00000008 & 1) != 0) {
      in_stack_ffffffffffffff68 =
           *(code **)(in_stack_00000008 + *(long *)(in_RDI + in_stack_00000010) + -1);
    }
    in_stack_ffffffffffffff70 = in_stack_00000008;
    iVar4 = (*in_stack_ffffffffffffff68)((long *)(in_RDI + in_stack_00000010),in_R8,puVar5);
    if (iVar4 == 0) break;
    uVar1 = local_4c;
    if ((iVar4 < 1) && (uVar1 = local_48, iVar4 < 0)) {
      local_4c = uVar3;
      local_44 = uVar3;
    }
  }
  *in_RSI = uVar3;
  in_RSI[2] = uVar3;
  return puVar5;
}

Assistant:

const uint8_t* searchWithComparison(SearchResult& result, const uint8_t* data, unsigned int count, const Key& key, KeyCompareOp compOp) const
	{
		const auto& self = static_cast<const Derived&>(*this);

		auto high = getBitsAt(data, 0) & UINT32_C(0x7FF), low = 0u;
		auto index = 0u;
		const uint8_t* subData;
		
		result.upperBound = high;

		while (low < high) {
			const auto mid = low + (high - low) / 2;
			index = mid + 1;

			const auto offset = getBitsAt(data, index);
			subData = advancePointer(data, offset);

			const auto ret = (self.*compOp)(key, subData);
			if (ret == 0) {
				result.lowerBound = mid;
				result.index = mid;
				goto done;
			} else if (ret > 0) {
				low = index;
			} else if (ret < 0) {
				high = mid;
				index = mid;
			}
		}
		
		subData = nullptr;

		result.lowerBound = index;
		result.index = INVALID_INDEX;
		
		if (count != 0 && index != result.upperBound) {
			const auto offset = getBitsAt(data, index + 1);
			subData = advancePointer(data, offset);
		}
		
	done:
		return subData;
	}